

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O0

void __thiscall
Eigen::Matrix<int,_4,_1,_0,_4,_1>::Matrix
          (Matrix<int,_4,_1,_0,_4,_1> *this,Scalar *x,Scalar *y,Scalar *z,Scalar *w)

{
  int iVar1;
  int *piVar2;
  Scalar *w_local;
  Scalar *z_local;
  Scalar *y_local;
  Scalar *x_local;
  Matrix<int,_4,_1,_0,_4,_1> *this_local;
  
  PlainObjectBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>::PlainObjectBase
            (&this->super_PlainObjectBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>);
  PlainObjectBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>::_check_template_params();
  iVar1 = *x;
  piVar2 = DenseStorage<int,_4,_4,_1,_0>::data((DenseStorage<int,_4,_4,_1,_0> *)this);
  *piVar2 = iVar1;
  iVar1 = *y;
  piVar2 = DenseStorage<int,_4,_4,_1,_0>::data((DenseStorage<int,_4,_4,_1,_0> *)this);
  piVar2[1] = iVar1;
  iVar1 = *z;
  piVar2 = DenseStorage<int,_4,_4,_1,_0>::data((DenseStorage<int,_4,_4,_1,_0> *)this);
  piVar2[2] = iVar1;
  iVar1 = *w;
  piVar2 = DenseStorage<int,_4,_4,_1,_0>::data((DenseStorage<int,_4,_4,_1,_0> *)this);
  piVar2[3] = iVar1;
  return;
}

Assistant:

Matrix(const Scalar& x, const Scalar& y, const Scalar& z, const Scalar& w)
    {
      Base::_check_template_params();
      EIGEN_STATIC_ASSERT_VECTOR_SPECIFIC_SIZE(Matrix, 4)
      m_storage.data()[0] = x;
      m_storage.data()[1] = y;
      m_storage.data()[2] = z;
      m_storage.data()[3] = w;
    }